

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

void __thiscall
Matrix::Matrix(Matrix *this,double *data,shared_array<double> *parent,int *sizes,int dimension)

{
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0015d708;
  (this->matrixParent).px = (double *)0x0;
  (this->matrixParent).pn.pi_ = (sp_counted_base *)0x0;
  (this->sMatrixName)._M_dataplus._M_p = (pointer)&(this->sMatrixName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->sMatrixName,"reference","");
  this->bReference = true;
  this->pData = data;
  boost::shared_array<double>::operator=(&this->matrixParent,parent);
  this->pSize = sizes;
  this->nMatrixDimension = dimension;
  init(this,(EVP_PKEY_CTX *)0x0);
  return;
}

Assistant:

Matrix::Matrix(double *data, shared_array<double> parent, int* sizes, int dimension) : sMatrixName("reference")
{
	bReference = true;
	pData = data;
	matrixParent = parent;
	pSize = sizes;
	nMatrixDimension = dimension;
	init(false);
}